

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double BitsEntropyRefine(VP8LBitEntropy *entropy)

{
  double local_28;
  double min_limit;
  double mix;
  VP8LBitEntropy *entropy_local;
  
  if (entropy->nonzeros < 5) {
    if (entropy->nonzeros < 2) {
      return 0.0;
    }
    if (entropy->nonzeros == 2) {
      return (double)entropy->sum * 0.99 + entropy->entropy * 0.01;
    }
    if (entropy->nonzeros == 3) {
      mix = 0.95;
    }
    else {
      mix = 0.7;
    }
  }
  else {
    mix = 0.627;
  }
  local_28 = mix * (double)(entropy->sum * 2 - entropy->max_val) + (1.0 - mix) * entropy->entropy;
  if (local_28 <= entropy->entropy) {
    local_28 = entropy->entropy;
  }
  return local_28;
}

Assistant:

static WEBP_INLINE double BitsEntropyRefine(const VP8LBitEntropy* entropy) {
  double mix;
  if (entropy->nonzeros < 5) {
    if (entropy->nonzeros <= 1) {
      return 0;
    }
    // Two symbols, they will be 0 and 1 in a Huffman code.
    // Let's mix in a bit of entropy to favor good clustering when
    // distributions of these are combined.
    if (entropy->nonzeros == 2) {
      return 0.99 * entropy->sum + 0.01 * entropy->entropy;
    }
    // No matter what the entropy says, we cannot be better than min_limit
    // with Huffman coding. I am mixing a bit of entropy into the
    // min_limit since it produces much better (~0.5 %) compression results
    // perhaps because of better entropy clustering.
    if (entropy->nonzeros == 3) {
      mix = 0.95;
    } else {
      mix = 0.7;  // nonzeros == 4.
    }
  } else {
    mix = 0.627;
  }

  {
    double min_limit = 2 * entropy->sum - entropy->max_val;
    min_limit = mix * min_limit + (1.0 - mix) * entropy->entropy;
    return (entropy->entropy < min_limit) ? min_limit : entropy->entropy;
  }
}